

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsInvalidMissingDescriptor_Test::
CommandLineInterfaceTest_EditionDefaultsInvalidMissingDescriptor_Test
          (CommandLineInterfaceTest_EditionDefaultsInvalidMissingDescriptor_Test *this)

{
  CommandLineInterfaceTest_EditionDefaultsInvalidMissingDescriptor_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)
       &PTR__CommandLineInterfaceTest_EditionDefaultsInvalidMissingDescriptor_Test_029fb460;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsInvalidMissingDescriptor) {
  CreateTempFile("features.proto", R"schema(
    syntax = "proto2";
    message Foo {}
  )schema");
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_out=$tmpdir/defaults "
      "features.proto");
  ExpectErrorSubstring("Could not find FeatureSet in descriptor pool");
}